

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::(anonymous_namespace)::
FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
::AllocateArray<std::__cxx11::string>
          (FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
           *this,int array_size)

{
  long lVar1;
  Nullable<const_char_*> failure_msg;
  int iVar2;
  int v1;
  LogMessageFatal local_20;
  
  if (*(long *)this == 0) {
    failure_msg = "has_allocated()";
    iVar2 = 0x1b0;
  }
  else {
    lVar1 = *(long *)(this + 8);
    iVar2 = *(int *)(this + 0xac);
    v1 = array_size + iVar2;
    *(int *)(this + 0xac) = v1;
    failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                            (v1,*(int *)(this + 0x74),"used <= total_.template Get<TypeToUse>()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (lVar1 + (long)iVar2 * 0x20);
    }
    iVar2 = 0x1b6;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,iVar2,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

bool has_allocated() const {
    return pointers_.template Get<char>() != nullptr;
  }